

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void handle_frame(cio_websocket *websocket,uint8_t *data,uint64_t length)

{
  uint_fast8_t length_00;
  uint_fast8_t opcode;
  uint64_t length_local;
  uint8_t *data_local;
  cio_websocket *websocket_local;
  
  if ((*(ushort *)&(websocket->ws_private).ws_flags >> 10 & 1) == 1) {
    cio_websocket_mask(data,length,(websocket->ws_private).received_mask);
  }
  length_00 = (uint_fast8_t)length;
  switch(*(byte *)&(websocket->ws_private).ws_flags >> 1 & 0xf) {
  case 1:
    handle_text_frame(websocket,data,length,((uint)(websocket->ws_private).ws_flags & 1) == 1);
    break;
  case 2:
    handle_binary_frame(websocket,data,length,((uint)(websocket->ws_private).ws_flags & 1) == 1);
    break;
  default:
    handle_error(websocket,CIO_PROTOCOL_NOT_SUPPORTED,CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,
                 "reserved opcode used");
    break;
  case 8:
    handle_close_frame(websocket,data,length_00);
    break;
  case 9:
    handle_ping_frame(websocket,data,length_00);
    break;
  case 10:
    handle_pong_frame(websocket,data,length_00);
  }
  return;
}

Assistant:

static void handle_frame(struct cio_websocket *websocket, uint8_t *data, uint64_t length)
{
	if (websocket->ws_private.ws_flags.is_server == 1U) {
		cio_websocket_mask(data, (size_t)length, websocket->ws_private.received_mask);
	}

	uint_fast8_t opcode = (uint_fast8_t)websocket->ws_private.ws_flags.opcode;
	switch (opcode) {
	case CIO_WEBSOCKET_BINARY_FRAME:
		handle_binary_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_TEXT_FRAME:
		handle_text_frame(websocket, data, length, websocket->ws_private.ws_flags.fin == 1U);
		break;

	case CIO_WEBSOCKET_PING_FRAME:
		handle_ping_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_PONG_FRAME:
		handle_pong_frame(websocket, data, (uint_fast8_t)length);
		break;

	case CIO_WEBSOCKET_CLOSE_FRAME:
		handle_close_frame(websocket, data, (uint_fast8_t)length);
		break;

	default:
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved opcode used");
		break;
	}
}